

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector_if<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__5,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__6>
                   (string *param_1,undefined8 param_2)

{
  bool bVar1;
  reference brk;
  size_type sVar2;
  reference pvVar3;
  BasicBrokerInfo *ele;
  const_iterator __end0;
  const_iterator __begin0;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *__range1;
  string *ret;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  string *this;
  string *in_stack_ffffffffffffff78;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_40;
  undefined8 local_38;
  allocator<char> local_1a;
  undefined1 local_19;
  undefined8 local_18;
  __6 local_a [2];
  string *local_8;
  
  local_19 = 0;
  this = param_1;
  local_18 = param_2;
  local_8 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::~allocator(&local_1a);
  local_38 = local_18;
  local_40._M_current =
       (BasicBrokerInfo *)
       gmlc::containers::
       DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
       ::begin(in_stack_ffffffffffffff48);
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  ::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                           ((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                            (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                             *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
    brk = __gnu_cxx::
          __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
          ::operator*(&local_40);
    in_stack_ffffffffffffff57 =
         helics::CoreBroker::
         generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::
         $_6::operator()(local_a,brk);
    if ((bool)in_stack_ffffffffffffff57) {
      helics::CoreBroker::
      generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::$_5
      ::operator()((anon_class_1_0_00000001 *)param_1,
                   (BasicBrokerInfo *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
      ;
      helics::generateJsonQuotedString(in_stack_ffffffffffffff78);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this,param_1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(this,(char)((ulong)param_1 >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
    ::operator++(&local_40);
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (this);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this,(char)((ulong)param_1 >> 0x38));
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    *pvVar3 = ']';
  }
  return param_1;
}

Assistant:

std::string generateStringVector_if(const X& data, Proc generator, validator valid)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        if (valid(ele)) {
            ret.append(helics::generateJsonQuotedString(generator(ele)));
            ret.push_back(',');
        }
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}